

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_client_async.cpp
# Opt level: O3

void __thiscall Client::Client(Client *this,io_context *io_context,string *host,string *port)

{
  protocol_type local_44;
  _Bind<void_(Client::*(Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(boost::system::error_code,_boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>)>
  local_40;
  
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            ((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)this,io_context,(type *)0x0);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&(this->resolver_).impl_,io_context,(type *)0x0);
  local_44.family_ = 2;
  local_40._M_f = (offset_in_Client_to_subr)OnResolve;
  local_40._8_8_ = 0;
  local_40._M_bound_args.
  super__Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
  super__Head_base<0UL,_Client_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
       (_Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)this;
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_resolve<std::_Bind<void(Client::*(Client*,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>)>>
            ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->resolver_,&local_44,host,port,0,&local_40);
  return;
}

Assistant:

Client::Client(boost::asio::io_context& io_context,
               const std::string& host, const std::string& port)
#if RESOLVE_ASYNC
    : socket_(io_context), resolver_(io_context) {
#else
    : socket_(io_context) {
#endif

#if RESOLVE_ASYNC

  resolver_.async_resolve(tcp::v4(), host, port,
                          std::bind(&Client::OnResolve, this,
                                    std::placeholders::_1,
                                    std::placeholders::_2));

#else

  // If you don't specify tcp::v4() as the first parameter (protocol) of
  // resolve(), the result will have two endpoints, one for v6, one for
  // v4. The first v6 endpoint will fail to connect.

  tcp::resolver resolver(io_context);

#if RESOLVE_IPV4_ONLY

  auto endpoints = resolver.resolve(tcp::v4(), host, port);
  // 127.0.0.1:2017, v4

#else

  auto endpoints = resolver.resolve(host, port);
  // [::1]:2017, v6
  // 127.0.0.1:2017, v4

#endif  // RESOLVE_IPV4_ONLY

  utility::PrintEndpoints(std::cout, endpoints);

  // ConnectHandler: void(boost::system::error_code, tcp::endpoint)
  boost::asio::async_connect(socket_, endpoints,
                             std::bind(&Client::OnConnect, this,
                                       std::placeholders::_1,
                                       std::placeholders::_2));

#endif  // RESOLVE_ASYNC
}